

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> __thiscall
bssl::CreateCertErrorParams2Der(bssl *this,char *name1,Input der1,char *name2,Input der2)

{
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>_>
  local_38;
  undefined1 local_30 [8];
  char *name2_local;
  char *name1_local;
  Input der1_local;
  
  der1_local.data_.data_ = (uchar *)der1.data_.size_;
  name1_local = (char *)der1.data_.data_;
  local_30 = (undefined1  [8])name2;
  name2_local = name1;
  der1_local.data_.size_ = (size_t)this;
  if (name1 == (char *)0x0) {
    abort();
  }
  if (name2 == (char *)0x0) {
    abort();
  }
  ::std::
  make_unique<bssl::(anonymous_namespace)::CertErrorParams2Der,char_const*&,bssl::der::Input&,char_const*&,bssl::der::Input&>
            ((char **)&local_38,(Input *)&name2_local,&name1_local,(Input *)local_30);
  ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>,void>
            ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)this,
             &local_38);
  ::std::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>_>
  ::~unique_ptr(&local_38);
  return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
          )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams2Der(const char *name1,
                                                           der::Input der1,
                                                           const char *name2,
                                                           der::Input der2) {
  BSSL_CHECK(name1);
  BSSL_CHECK(name2);
  return std::make_unique<CertErrorParams2Der>(name1, der1, name2, der2);
}